

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::disconnectTiming(CoreBroker *this,ActionMessage *command)

{
  BaseTimeCoordinator *pBVar1;
  int iVar2;
  
  if ((this->super_BrokerBase).hasTimeDependency == true) {
    if ((this->super_BrokerBase).enteredExecutionMode == false) {
      if (INITIALIZING < (this->super_BrokerBase).brokerState._M_i) {
        iVar2 = (*((this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
                  _vptr_BaseTimeCoordinator[3])();
        if ((char)iVar2 != '\0') {
          pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          iVar2 = (*pBVar1->_vptr_BaseTimeCoordinator[9])(pBVar1,0x8831d580);
          if ((char)iVar2 == '\0') {
            (this->super_BrokerBase).enteredExecutionMode = true;
          }
        }
      }
    }
    else {
      iVar2 = (*((this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
                _vptr_BaseTimeCoordinator[3])();
      if ((char)iVar2 != '\0') {
        (*((this->super_BrokerBase).timeCoord._M_t.
           super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
           .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
          _vptr_BaseTimeCoordinator[2])();
        return;
      }
    }
  }
  return;
}

Assistant:

void CoreBroker::disconnectTiming(ActionMessage& command)
{
    if (hasTimeDependency) {
        if (!enteredExecutionMode) {
            if (getBrokerState() >= BrokerState::OPERATING) {
                if (timeCoord->processTimeMessage(command) != TimeProcessingResult::NOT_PROCESSED) {
                    auto res = timeCoord->checkExecEntry();
                    if (res == MessageProcessingResult::NEXT_STEP) {
                        enteredExecutionMode = true;
                    }
                }
            }
        } else {
            if (timeCoord->processTimeMessage(command) != TimeProcessingResult::NOT_PROCESSED) {
                timeCoord->updateTimeFactors();
            }
        }
    }
}